

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint64 uVar9;
  char *pcVar10;
  pair<unsigned_long,_unsigned_long> pVar11;
  pair<unsigned_long,_unsigned_long> pVar12;
  uint128 uVar13;
  uint64 local_48;
  
  uVar5 = seed.second;
  uVar3 = seed.first;
  if (len < 0x80) {
    if (len < 0x11) {
      uVar7 = (uVar3 * -0x4b6d499041670d8d >> 0x2f ^ uVar3 * -0x4b6d499041670d8d) *
              -0x4b6d499041670d8d;
      uVar1 = HashLen0to16(s,len);
      uVar1 = uVar1 + uVar5 * -0x4b6d499041670d8d;
      uVar3 = uVar1;
      if (7 < len) {
        uVar3 = *(uint64 *)s;
      }
      uVar9 = uVar3 + uVar7 >> 0x2f ^ uVar3 + uVar7;
    }
    else {
      uVar1 = HashLen16(*(long *)(s + (len - 8)) + 0xb492b66fbe98f273,uVar3);
      uVar9 = HashLen16(uVar5 + len,uVar1 + *(long *)(s + (len - 0x10)));
      uVar7 = uVar9 + uVar3;
      do {
        uVar7 = (((ulong)(*(long *)s * -0x4b6d499041670d8d) >> 0x2f ^
                 *(long *)s * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar7) *
                -0x4b6d499041670d8d;
        uVar5 = uVar5 ^ uVar7;
        uVar1 = (((ulong)(*(long *)((long)s + 8) * -0x4b6d499041670d8d) >> 0x2f ^
                 *(long *)((long)s + 8) * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar1) *
                -0x4b6d499041670d8d;
        uVar9 = uVar9 ^ uVar1;
        s = (char *)((long)s + 0x10);
        len = len - 0x10;
      } while (0x10 < len);
    }
    uVar2 = HashLen16(uVar7,uVar1);
    local_48 = HashLen16(uVar9,uVar5);
    uVar5 = local_48 ^ uVar2;
  }
  else {
    uVar6 = ((uVar5 ^ 0xb492b66fbe98f273) << 0xf | (uVar5 ^ 0xb492b66fbe98f273) >> 0x31) *
            -0x4b6d499041670d8d + *(long *)s;
    uVar7 = len * -0x4b6d499041670d8d;
    pVar11.second = (uVar6 * 0x400000 | uVar6 >> 0x2a) * -0x4b6d499041670d8d + *(long *)(s + 8);
    pVar11.first = uVar6;
    pVar12.second =
         ((*(long *)(s + 0x58) + uVar3) * 0x800 | *(long *)(s + 0x58) + uVar3 >> 0x35) *
         -0x4b6d499041670d8d;
    pVar12.first = ((uVar5 + uVar7) * 0x20000000 | uVar5 + uVar7 >> 0x23) * -0x4b6d499041670d8d +
                   uVar3;
    pcVar10 = s + 0x40;
    sVar4 = len;
    do {
      uVar6 = uVar3 + pVar11.first + uVar5 + *(long *)(pcVar10 + -0x30);
      uVar5 = uVar5 + pVar11.second + *(long *)(pcVar10 + -0x10);
      uVar6 = (uVar6 * 0x8000000 | uVar6 >> 0x25) * -0x4b6d499041670d8d ^ pVar12.second;
      uVar5 = (uVar5 * 0x400000 | uVar5 >> 0x2a) * -0x4b6d499041670d8d ^ pVar11.first;
      uVar7 = uVar7 ^ pVar12.first;
      uVar7 = uVar7 << 0x1f | uVar7 >> 0x21;
      pVar11 = WeakHashLen32WithSeeds
                         (pcVar10 + -0x40,pVar11.second * -0x4b6d499041670d8d,pVar12.first + uVar6);
      pVar12 = WeakHashLen32WithSeeds(pcVar10 + -0x20,pVar12.second + uVar7,uVar5);
      uVar7 = uVar7 + pVar11.first + *(long *)(pcVar10 + 0x10) + uVar5;
      uVar5 = uVar5 + pVar11.second + *(long *)(pcVar10 + 0x30);
      uVar7 = (uVar7 * 0x8000000 | uVar7 >> 0x25) * -0x4b6d499041670d8d ^ pVar12.second;
      uVar5 = (uVar5 * 0x400000 | uVar5 >> 0x2a) * -0x4b6d499041670d8d ^ pVar11.first;
      uVar6 = uVar6 ^ pVar12.first;
      uVar3 = uVar6 << 0x1f | uVar6 >> 0x21;
      pVar11 = WeakHashLen32WithSeeds
                         (pcVar10,pVar11.second * -0x4b6d499041670d8d,pVar12.first + uVar7);
      pVar12 = WeakHashLen32WithSeeds(pcVar10 + 0x20,pVar12.second + uVar3,uVar5);
      sVar4 = sVar4 - 0x80;
      pcVar10 = pcVar10 + 0x80;
    } while (0x7f < sVar4);
    uVar1 = uVar5 + uVar7 + (pVar12.first << 0x1b | pVar12.first >> 0x25) * -0x3c5a37a36834ced9;
    uVar7 = pVar11.first + uVar7;
    uVar7 = (uVar7 * 0x8000 | uVar7 >> 0x31) * -0x3c5a37a36834ced9 + uVar3;
    uVar5 = 0;
    pcVar10 = s + len;
    while( true ) {
      local_48 = pVar12.second;
      uVar9 = pVar11.second;
      uVar3 = pVar11.first;
      if (sVar4 <= uVar5) break;
      uVar5 = uVar5 + 0x20;
      lVar8 = pVar12.first + *(long *)(pcVar10 + -0x10);
      uVar1 = ((uVar1 - uVar7) * 0x400000 | uVar1 - uVar7 >> 0x2a) * -0x3c5a37a36834ced9 + uVar9;
      uVar7 = (uVar7 << 0xf | uVar7 >> 0x31) * -0x3c5a37a36834ced9 + lVar8;
      pVar12.second = local_48;
      pVar12.first = lVar8 + uVar3;
      pVar11 = WeakHashLen32WithSeeds(pcVar10 + -0x20,uVar3,uVar9);
      pcVar10 = pcVar10 + -0x20;
    }
    uVar3 = HashLen16(uVar7,uVar3);
    uVar2 = HashLen16(uVar1,pVar12.first);
    uVar1 = HashLen16(uVar3 + uVar9,local_48);
    uVar5 = uVar1 + uVar2;
    local_48 = local_48 + uVar3;
    uVar2 = uVar2 + uVar9;
  }
  uVar3 = HashLen16(local_48,uVar2);
  uVar13.second = uVar3;
  uVar13.first = uVar5;
  return uVar13;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 16), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y ^= v.first;
    z = Rotate(z ^ w.first, 33);
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y);
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 16), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y ^= v.first;
    z = Rotate(z ^ w.first, 33);
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y);
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  y += Rotate(w.first, 37) * k0 + z;
  x += Rotate(v.first + z, 49) * k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(y - x, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = Rotate(x, 49) * k0 + w.first;
    w.first += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first, v.second);
  }
  // At this point our 48 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 48-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}